

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O1

int run_test_timer_ref(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_loop_t *puVar3;
  undefined8 in_R9;
  uv_timer_t h;
  uv_timer_t uStack_148;
  uv_loop_t *puStack_b0;
  uv_timer_t local_a0;
  
  puStack_b0 = (uv_loop_t *)0x166b32;
  puVar2 = uv_default_loop();
  puStack_b0 = (uv_loop_t *)0x166b42;
  uv_timer_init(puVar2,&local_a0);
  puStack_b0 = (uv_loop_t *)0x166b4a;
  uv_unref((uv_handle_t *)&local_a0);
  puStack_b0 = (uv_loop_t *)0x166b4f;
  puVar2 = uv_default_loop();
  puStack_b0 = (uv_loop_t *)0x166b59;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_b0 = (uv_loop_t *)0x166b61;
  do_close(&local_a0);
  puStack_b0 = (uv_loop_t *)0x166b66;
  puVar2 = uv_default_loop();
  puStack_b0 = (uv_loop_t *)0x166b7a;
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  puStack_b0 = (uv_loop_t *)0x166b84;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_b0 = (uv_loop_t *)0x166b89;
  puVar3 = uv_default_loop();
  puStack_b0 = (uv_loop_t *)0x166b91;
  iVar1 = uv_loop_close(puVar3);
  if (iVar1 == 0) {
    return 0;
  }
  puStack_b0 = (uv_loop_t *)run_test_timer_ref2;
  run_test_timer_ref_cold_1();
  puStack_b0 = puVar2;
  puVar2 = uv_default_loop();
  uv_timer_init(puVar2,&uStack_148);
  uv_timer_start(&uStack_148,fail_cb,0x2a,0x2a);
  uv_unref((uv_handle_t *)&uStack_148);
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  do_close(&uStack_148);
  puVar2 = uv_default_loop();
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  uv_run(puVar2,UV_RUN_DEFAULT);
  puVar3 = uv_default_loop();
  iVar1 = uv_loop_close(puVar3);
  if (iVar1 == 0) {
    return 0;
  }
  run_test_timer_ref2_cold_1();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
          ,0x39,"fail_cb should not have been called",in_R9,puVar2);
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(timer_ref) {
  uv_timer_t h;
  uv_timer_init(uv_default_loop(), &h);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY();
  return 0;
}